

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

void __thiscall
Hospital::Read_From_File_And_Create_Objects<Patient>
          (Hospital *this,vector<Patient,_std::allocator<Patient>_> *All_Of_Humans,fstream *inFile)

{
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long *plVar4;
  string password;
  string password_00;
  string password_01;
  string age;
  string age_00;
  string age_01;
  string gender;
  string gender_00;
  string gender_01;
  string dammy2;
  string dammy2_00;
  string dammy2_01;
  string dammy;
  string dammy_00;
  string dammy_01;
  string dammy1;
  string dammy1_00;
  string dammy1_01;
  pointer pbVar5;
  pointer pbVar6;
  long lVar7;
  ostream *poVar8;
  pointer pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  int iVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  undefined8 uStack_610;
  string s;
  undefined1 *local_5c0;
  undefined8 in_stack_fffffffffffffa48;
  long in_stack_fffffffffffffa50;
  undefined8 in_stack_fffffffffffffa58;
  long *in_stack_fffffffffffffa60;
  long local_590 [2];
  long *local_580 [2];
  long local_570 [2];
  long *local_560 [2];
  long local_550 [2];
  long *local_540 [2];
  long local_530 [2];
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  long *local_4a0 [2];
  long local_490 [2];
  long *local_480 [2];
  long local_470 [2];
  long *local_460 [2];
  long local_450 [2];
  long *local_440 [2];
  long local_430 [2];
  long *local_420 [2];
  long local_410 [2];
  string local_400;
  string local_3e0;
  string local_3c0;
  long *local_3a0 [2];
  long local_390 [2];
  long *local_380 [2];
  long local_370 [2];
  long *local_360 [2];
  long local_350 [2];
  long *local_340 [2];
  long local_330 [2];
  long *local_320 [2];
  long local_310 [2];
  string local_300;
  string local_2e0;
  string local_2c0;
  long *local_2a0 [2];
  long local_290 [2];
  string local_280;
  long *local_260 [2];
  long local_250 [2];
  string local_240;
  string local_220;
  long *local_200 [2];
  long local_1f0 [2];
  string local_1e0;
  string local_1c0;
  string item;
  Patient New_Nurse;
  
  if (((byte)inFile[*(long *)(*(long *)inFile + -0x18) + 0x20] & 5) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error opening file !!! ");
    std::endl<char,std::char_traits<char>>(poVar8);
    exit(1);
  }
  item._M_dataplus._M_p = (pointer)&item.field_2;
  item._M_string_length = 0;
  item.field_2._M_local_buf[0] = '\0';
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  s._M_dataplus._M_p = (pointer)&s.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&s,"7Patient","");
  if (((byte)inFile[*(long *)(*(long *)inFile + -0x18) + 0x20] & 2) == 0) {
    this_00 = &New_Nurse.Bill_Info;
    this_01 = &New_Nurse.patient_all_ino;
    paVar1 = &New_Nurse.Cost.field_2;
    paVar2 = &New_Nurse.Gender.field_2;
    iVar11 = 0;
    do {
      std::operator>>((istream *)inFile,(string *)&item);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&temp,&item);
      lVar7 = std::__cxx11::string::find((char *)&s,0x12a87d,0);
      if (iVar11 == 9 && lVar7 != -1) {
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        pcVar3 = ((temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c0,pcVar3,
                   pcVar3 + (temp.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e0,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c0,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[3]._M_string_length);
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_300,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[4]._M_string_length);
        local_320[0] = local_310;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[5]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_320,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[5]._M_string_length);
        local_340[0] = local_330;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[6]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_340,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[6]._M_string_length);
        local_360[0] = local_350;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[7]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_360,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[7]._M_string_length);
        local_380[0] = local_370;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[8]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_380,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[8]._M_string_length);
        local_3a0[0] = local_390;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[9]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3a0,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[9]._M_string_length);
        local_200[0] = local_1f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"salam","");
        password._M_string_length = (size_type)local_340;
        password._M_dataplus._M_p = (pointer)local_320;
        password.field_2._M_allocated_capacity = (size_type)local_360;
        password.field_2._8_8_ = local_380;
        age._M_string_length = (size_type)local_200;
        age._M_dataplus._M_p = (pointer)local_3a0;
        age.field_2._M_allocated_capacity =
             (size_type)
             temp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        age.field_2._8_8_ =
             temp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        gender._M_string_length = uStack_610;
        gender._M_dataplus._M_p =
             (pointer)temp.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        gender.field_2._M_allocated_capacity = (size_type)paVar2;
        gender.field_2._8_8_ = paVar1;
        dammy2._M_string_length = (size_type)this_00;
        dammy2._M_dataplus._M_p = (pointer)this_01;
        dammy2.field_2._M_allocated_capacity = (size_type)All_Of_Humans;
        dammy2.field_2._8_8_ = s._M_dataplus._M_p;
        dammy._M_string_length = s.field_2._M_allocated_capacity;
        dammy._M_dataplus._M_p = (pointer)s._M_string_length;
        dammy.field_2._M_allocated_capacity = s.field_2._8_8_;
        dammy.field_2._8_8_ = local_5c0;
        dammy1._M_string_length = in_stack_fffffffffffffa50;
        dammy1._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa48;
        dammy1.field_2._M_allocated_capacity = in_stack_fffffffffffffa58;
        dammy1.field_2._8_8_ = in_stack_fffffffffffffa60;
        Patient::Patient(&New_Nurse,&local_1c0,&local_1e0,&local_2c0,&local_2e0,&local_300,password,
                         age,gender,dammy2,dammy,dammy1);
        if (local_200[0] != local_1f0) {
          operator_delete(local_200[0],local_1f0[0] + 1);
        }
        if (local_3a0[0] != local_390) {
          operator_delete(local_3a0[0],local_390[0] + 1);
        }
        if (local_380[0] != local_370) {
          operator_delete(local_380[0],local_370[0] + 1);
        }
        if (local_360[0] != local_350) {
          operator_delete(local_360[0],local_350[0] + 1);
        }
        if (local_340[0] != local_330) {
          operator_delete(local_340[0],local_330[0] + 1);
        }
        if (local_320[0] != local_310) {
          operator_delete(local_320[0],local_310[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        std::vector<Patient,_std::allocator<Patient>_>::push_back(All_Of_Humans,&New_Nurse);
        pbVar6 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar5 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (temp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            temp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar10 = &(temp.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar10 + -1))->_M_dataplus)._M_p;
            if (paVar10 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar4) {
              operator_delete(plVar4,paVar10->_M_allocated_capacity + 1);
            }
            pbVar9 = (pointer)(paVar10 + 1);
            paVar10 = paVar10 + 2;
          } while (pbVar9 != pbVar6);
          temp.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
        }
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(this_01);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)New_Nurse.Cost._M_dataplus._M_p != paVar1) {
          operator_delete(New_Nurse.Cost._M_dataplus._M_p,
                          New_Nurse.Cost.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)New_Nurse.Gender._M_dataplus._M_p != paVar2) {
          operator_delete(New_Nurse.Gender._M_dataplus._M_p,
                          New_Nurse.Gender.field_2._M_allocated_capacity + 1);
        }
LAB_00124aba:
        Human::~Human(&New_Nurse.super_Human);
        iVar11 = -1;
      }
      else {
        lVar7 = std::__cxx11::string::find((char *)&s,0x12a889,0);
        if (iVar11 == 10 && lVar7 != -1) {
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          pcVar3 = ((temp.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_220,pcVar3,
                     pcVar3 + (temp.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_240,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3c0,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
          local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3e0,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[3]._M_string_length);
          local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_400,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[4]._M_string_length);
          local_420[0] = local_410;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[5]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_420,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[5]._M_string_length);
          local_440[0] = local_430;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[6]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_440,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[6]._M_string_length);
          local_460[0] = local_450;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[7]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_460,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[7]._M_string_length);
          local_480[0] = local_470;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[8]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_480,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[8]._M_string_length);
          local_4a0[0] = local_490;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[9]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4a0,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[9]._M_string_length);
          local_260[0] = local_250;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[10]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_260,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[10]._M_string_length);
          password_00._M_string_length = (size_type)local_440;
          password_00._M_dataplus._M_p = (pointer)local_420;
          password_00.field_2._M_allocated_capacity = (size_type)local_460;
          password_00.field_2._8_8_ = local_480;
          age_00._M_string_length = (size_type)local_260;
          age_00._M_dataplus._M_p = (pointer)local_4a0;
          age_00.field_2._M_allocated_capacity =
               (size_type)
               temp.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          age_00.field_2._8_8_ =
               temp.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          gender_00._M_string_length = uStack_610;
          gender_00._M_dataplus._M_p =
               (pointer)temp.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          gender_00.field_2._M_allocated_capacity = (size_type)paVar2;
          gender_00.field_2._8_8_ = paVar1;
          dammy2_00._M_string_length = (size_type)this_00;
          dammy2_00._M_dataplus._M_p = (pointer)this_01;
          dammy2_00.field_2._M_allocated_capacity = (size_type)All_Of_Humans;
          dammy2_00.field_2._8_8_ = s._M_dataplus._M_p;
          dammy_00._M_string_length = s.field_2._M_allocated_capacity;
          dammy_00._M_dataplus._M_p = (pointer)s._M_string_length;
          dammy_00.field_2._M_allocated_capacity = s.field_2._8_8_;
          dammy_00.field_2._8_8_ = local_5c0;
          dammy1_00._M_string_length = in_stack_fffffffffffffa50;
          dammy1_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa48;
          dammy1_00.field_2._M_allocated_capacity = in_stack_fffffffffffffa58;
          dammy1_00.field_2._8_8_ = in_stack_fffffffffffffa60;
          Patient::Patient(&New_Nurse,&local_220,&local_240,&local_3c0,&local_3e0,&local_400,
                           password_00,age_00,gender_00,dammy2_00,dammy_00,dammy1_00);
          if (local_260[0] != local_250) {
            operator_delete(local_260[0],local_250[0] + 1);
          }
          if (local_4a0[0] != local_490) {
            operator_delete(local_4a0[0],local_490[0] + 1);
          }
          if (local_480[0] != local_470) {
            operator_delete(local_480[0],local_470[0] + 1);
          }
          if (local_460[0] != local_450) {
            operator_delete(local_460[0],local_450[0] + 1);
          }
          if (local_440[0] != local_430) {
            operator_delete(local_440[0],local_430[0] + 1);
          }
          if (local_420[0] != local_410) {
            operator_delete(local_420[0],local_410[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._M_dataplus._M_p != &local_400.field_2) {
            operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
            operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          std::vector<Patient,_std::allocator<Patient>_>::push_back(All_Of_Humans,&New_Nurse);
          pbVar6 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar5 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (temp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              temp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar10 = &(temp.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar10 + -1))->_M_dataplus)._M_p;
              if (paVar10 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar4) {
                operator_delete(plVar4,paVar10->_M_allocated_capacity + 1);
              }
              pbVar9 = (pointer)(paVar10 + 1);
              paVar10 = paVar10 + 2;
            } while (pbVar9 != pbVar6);
            temp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
          }
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~vector(this_00);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this_01);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Cost._M_dataplus._M_p != paVar1) {
            operator_delete(New_Nurse.Cost._M_dataplus._M_p,
                            New_Nurse.Cost.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Gender._M_dataplus._M_p != paVar2) {
            operator_delete(New_Nurse.Gender._M_dataplus._M_p,
                            New_Nurse.Gender.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00124aba;
        }
        lVar7 = std::__cxx11::string::find((char *)&s,0x12a890,0);
        if (iVar11 == 7 && lVar7 != -1) {
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          pcVar3 = ((temp.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_280,pcVar3,
                     pcVar3 + (temp.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
          local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4c0,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
          local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4e0,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_500,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[3]._M_string_length);
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_520,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[4]._M_string_length);
          local_540[0] = local_530;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[5]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_540,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[5]._M_string_length);
          local_560[0] = local_550;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[6]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_560,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[6]._M_string_length);
          local_580[0] = local_570;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[7]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_580,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[7]._M_string_length);
          in_stack_fffffffffffffa60 = local_590;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffa60,"salam1","");
          local_5c0 = &stack0xfffffffffffffa50;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"salam1","");
          local_2a0[0] = local_290;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"salam2","");
          password_01._M_string_length = (size_type)local_560;
          password_01._M_dataplus._M_p = (pointer)local_540;
          password_01.field_2._M_allocated_capacity = (size_type)local_580;
          password_01.field_2._8_8_ = &stack0xfffffffffffffa60;
          age_01._M_string_length = (size_type)local_2a0;
          age_01._M_dataplus._M_p = (pointer)&local_5c0;
          age_01.field_2._M_allocated_capacity =
               (size_type)
               temp.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          age_01.field_2._8_8_ =
               temp.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          gender_01._M_string_length = uStack_610;
          gender_01._M_dataplus._M_p =
               (pointer)temp.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          gender_01.field_2._M_allocated_capacity = (size_type)paVar2;
          gender_01.field_2._8_8_ = paVar1;
          dammy2_01._M_string_length = (size_type)this_00;
          dammy2_01._M_dataplus._M_p = (pointer)this_01;
          dammy2_01.field_2._M_allocated_capacity = (size_type)All_Of_Humans;
          dammy2_01.field_2._8_8_ = s._M_dataplus._M_p;
          dammy_01._M_string_length = s.field_2._M_allocated_capacity;
          dammy_01._M_dataplus._M_p = (pointer)s._M_string_length;
          dammy_01.field_2._M_allocated_capacity = s.field_2._8_8_;
          dammy_01.field_2._8_8_ = local_5c0;
          dammy1_01._M_string_length = in_stack_fffffffffffffa50;
          dammy1_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa48;
          dammy1_01.field_2._M_allocated_capacity = in_stack_fffffffffffffa58;
          dammy1_01.field_2._8_8_ = in_stack_fffffffffffffa60;
          Patient::Patient(&New_Nurse,&local_280,&local_4c0,&local_4e0,&local_500,&local_520,
                           password_01,age_01,gender_01,dammy2_01,dammy_01,dammy1_01);
          if (local_2a0[0] != local_290) {
            operator_delete(local_2a0[0],local_290[0] + 1);
          }
          if (local_5c0 != &stack0xfffffffffffffa50) {
            operator_delete(local_5c0,in_stack_fffffffffffffa50 + 1);
          }
          if (in_stack_fffffffffffffa60 != local_590) {
            operator_delete(in_stack_fffffffffffffa60,local_590[0] + 1);
          }
          if (local_580[0] != local_570) {
            operator_delete(local_580[0],local_570[0] + 1);
          }
          if (local_560[0] != local_550) {
            operator_delete(local_560[0],local_550[0] + 1);
          }
          if (local_540[0] != local_530) {
            operator_delete(local_540[0],local_530[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
            operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
            operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          }
          std::vector<Patient,_std::allocator<Patient>_>::push_back(All_Of_Humans,&New_Nurse);
          pbVar6 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar5 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (temp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              temp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar10 = &(temp.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar10 + -1))->_M_dataplus)._M_p;
              if (paVar10 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar4) {
                operator_delete(plVar4,paVar10->_M_allocated_capacity + 1);
              }
              pbVar9 = (pointer)(paVar10 + 1);
              paVar10 = paVar10 + 2;
            } while (pbVar9 != pbVar6);
            temp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
          }
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~vector(this_00);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this_01);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Cost._M_dataplus._M_p != paVar1) {
            operator_delete(New_Nurse.Cost._M_dataplus._M_p,
                            New_Nurse.Cost.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Gender._M_dataplus._M_p != paVar2) {
            operator_delete(New_Nurse.Gender._M_dataplus._M_p,
                            New_Nurse.Gender.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00124aba;
        }
      }
      iVar11 = iVar11 + 1;
    } while (((byte)inFile[*(long *)(*(long *)inFile + -0x18) + 0x20] & 2) == 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p,s.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&temp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)item._M_dataplus._M_p != &item.field_2) {
    operator_delete(item._M_dataplus._M_p,
                    CONCAT71(item.field_2._M_allocated_capacity._1_7_,item.field_2._M_local_buf[0])
                    + 1);
  }
  return;
}

Assistant:

void Hospital::Read_From_File_And_Create_Objects (vector<T>& All_Of_Humans , fstream& inFile){

    if (inFile.fail()){
        cerr << "Error opening file !!! " <<endl;
        exit(1) ;
    }

    int counter = 0 ;
    string item;
    vector<string>temp;
    string s=typeid(T).name();
    while(!inFile.eof()){

        inFile >> item ;
        temp.push_back(item);
        if(s.find("Nurse")!=string::npos && counter == 9){

            T New_Nurse(temp[0], temp[1], temp[2], temp[3], temp[4], temp[5], temp[6], temp[7], temp[8],
                        temp[9] ,"salam");
            All_Of_Humans.push_back(New_Nurse);
            temp.clear();
            counter = -1;

        }
        else if(s.find("Doctor")!=string::npos  && counter == 10) {

            T New_Doctor(temp[0], temp[1], temp[2], temp[3], temp[4], temp[5], temp[6], temp[7], temp[8],
                         temp[9], temp[10] );

            All_Of_Humans.push_back(New_Doctor);
            temp.clear();
            counter =-1;

        }
        else if (s.find("Patient")!=string::npos  && counter == 7) {

            T New_Patient(temp[0], temp[1], temp[2], temp[3], temp[4], temp[5], temp[6], temp[7],"salam1","salam1","salam2"
            );
            All_Of_Humans.push_back(New_Patient);
            temp.clear();
            counter = -1;
        }

        counter++;

    }
}